

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::TestShortcutRouting(ImGuiKeyChord key_chord,ImGuiID owner_id)

{
  ImGuiKeyChord key_chord_00;
  ImGuiKeyRoutingData *pIVar1;
  
  if (0xfffffffd < owner_id - 1) {
    owner_id = GImGui->CurrentFocusScopeId;
  }
  key_chord_00 = FixupKeyChord(key_chord);
  pIVar1 = GetShortcutRoutingData(key_chord_00);
  return pIVar1->RoutingCurr == owner_id;
}

Assistant:

bool ImGui::TestShortcutRouting(ImGuiKeyChord key_chord, ImGuiID owner_id)
{
    const ImGuiID routing_id = GetRoutingIdFromOwnerId(owner_id);
    key_chord = FixupKeyChord(key_chord);
    ImGuiKeyRoutingData* routing_data = GetShortcutRoutingData(key_chord); // FIXME: Could avoid creating entry.
    return routing_data->RoutingCurr == routing_id;
}